

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O1

void * UNPK_addEntry(void *opaque,char *name,int isdir,PHYSFS_sint64 ctime,PHYSFS_sint64 mtime,
                    PHYSFS_uint64 pos,PHYSFS_uint64 len)

{
  void *pvVar1;
  
  pvVar1 = __PHYSFS_DirTreeAdd((__PHYSFS_DirTree *)opaque,name,isdir);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    if (isdir != 0) {
      len = 0;
      pos = 0;
    }
    *(PHYSFS_uint64 *)((long)pvVar1 + 0x28) = pos;
    *(PHYSFS_uint64 *)((long)pvVar1 + 0x30) = len;
    *(PHYSFS_sint64 *)((long)pvVar1 + 0x38) = ctime;
    *(PHYSFS_sint64 *)((long)pvVar1 + 0x40) = mtime;
  }
  return pvVar1;
}

Assistant:

void *UNPK_addEntry(void *opaque, char *name, const int isdir,
                    const PHYSFS_sint64 ctime, const PHYSFS_sint64 mtime,
                    const PHYSFS_uint64 pos, const PHYSFS_uint64 len)
{
    UNPKinfo *info = (UNPKinfo *) opaque;
    UNPKentry *entry;

    entry = (UNPKentry *) __PHYSFS_DirTreeAdd(&info->tree, name, isdir);
    BAIL_IF_ERRPASS(!entry, NULL);

    entry->startPos = isdir ? 0 : pos;
    entry->size = isdir ? 0 : len;
    entry->ctime = ctime;
    entry->mtime = mtime;

    return entry;
}